

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.cpp
# Opt level: O1

KUINT16 __thiscall
KDIS::KDataStream::CopyIntoBuffer
          (KDataStream *this,KOCTET *Buffer,KUINT16 BufferSize,KUINT16 WritePos)

{
  pointer puVar1;
  KException *this_00;
  pointer puVar2;
  undefined6 in_register_0000000a;
  ulong uVar3;
  undefined6 in_register_00000012;
  
  uVar3 = CONCAT62(in_register_0000000a,WritePos);
  puVar2 = (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((int)CONCAT62(in_register_00000012,BufferSize) - (int)uVar3 <
      (int)((int)puVar1 - (int)puVar2 & 0xffffU)) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    KException::KException(this_00,1);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  for (; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    Buffer[uVar3 & 0xffff] = *puVar2;
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  return (short)*(undefined4 *)
                 &(this->m_vBuffer).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
         (short)*(undefined4 *)
                 &(this->m_vBuffer).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
}

Assistant:

KUINT16 KDataStream::CopyIntoBuffer(KOCTET *Buffer, KUINT16 BufferSize, KUINT16 WritePos /*= 0*/ ) const noexcept(false)
{
    if( ( BufferSize - WritePos ) < ( KUINT16 )m_vBuffer.size() )
    {
        throw KException( BUFFER_TOO_SMALL );
    }

    auto citr = m_vBuffer.begin();
    auto citrEnd = m_vBuffer.end();

    KUINT16 CurrentWritePos = WritePos;

    for( ; citr != citrEnd; ++citr, ++CurrentWritePos )
    {
        Buffer[CurrentWritePos] = *citr;
    }

    return static_cast<KUINT16>(m_vBuffer.size());
}